

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

void __thiscall Js::DateImplementation::DateImplementation(DateImplementation *this,double value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dVar4;
  
  bVar2 = ThreadContext::IsOnStack(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x81,"(!ThreadContext::IsOnStack(this))",
                                "!ThreadContext::IsOnStack(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::AssertValue<unsigned_char>(this,'\0',0x60);
  this->field_0x58 = this->field_0x58 & 0xfe;
  this->m_grfval = 0;
  dVar4 = DoubleToTvUtc(value);
  this->m_tvUtc = dVar4;
  return;
}

Assistant:

DateImplementation::DateImplementation(double value)
    {
        // Assume DateImplementation is allocated in the recycler and is zero initialized
        // Do not stack allocate of this struct, as it doesn't initialize all fields.
        // If the stack allocated struct is copied in to recycler allocated ones, it
        // many introduce false reference from the stack

        Assert(!ThreadContext::IsOnStack(this));
        AssertValue<byte>(this, 0, sizeof(DateImplementation));

        m_modified = false;

        SetTvUtc(value);
    }